

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

Object * __thiscall
Engine::executeGlobalFunction(Engine *this,uint functionName,Object **args,uint argc)

{
  int iVar1;
  runtime_error *this_00;
  CallArgs *this_01;
  undefined4 extraout_var;
  uint local_4c;
  uint i;
  Object *result;
  CallArgs *callArgs;
  uint argc_local;
  Object **args_local;
  uint functionName_local;
  Engine *this_local;
  
  if (this->globalFunctionsCount <= functionName) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Engine::executeGlobalFunction => out of range!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (CallArgs *)operator_new(0x38);
  CallArgs::CallArgs(this_01,GLOBAL);
  addToCallStack(this,this_01);
  iVar1 = (**this->globalFunctions[functionName]->_vptr_IGlobalFunction)
                    (this->globalFunctions[functionName],args,(ulong)argc);
  removeFromCallStack(this);
  for (local_4c = 0; local_4c < argc; local_4c = local_4c + 1) {
    if (args[local_4c] != (Object *)0x0) {
      operator_delete(args[local_4c]);
    }
  }
  if (args != (Object **)0x0) {
    operator_delete__(args);
  }
  return (Object *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Object* Engine::executeGlobalFunction(unsigned int functionName, Object** args, unsigned int argc) {
	if (functionName < 0 || functionName >= this->globalFunctionsCount) {
		throw std::runtime_error("Engine::executeGlobalFunction => out of range!");
	}
	CallArgs* callArgs = new CallArgs(GLOBAL);
	addToCallStack(callArgs);
	Object* result = this->globalFunctions[functionName]->execute(args, argc);
	removeFromCallStack();
	
	unsigned int i;
	for (i = 0; i < argc; i++) {
		delete args[i];
	}
	delete[] args;
	
	return result;
}